

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

size_t __thiscall entityx::EventManager::connected_receivers(EventManager *this)

{
  bool bVar1;
  long in_RDI;
  EventSignalPtr handler;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *__range2;
  size_t size;
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
  *in_stack_ffffffffffffffb0;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *in_stack_ffffffffffffffc0;
  __shared_ptr local_38 [16];
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *local_28;
  __normal_iterator<const_std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_*,_std::vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>_>
  local_20;
  long local_18;
  size_t local_10;
  
  local_10 = 0;
  local_18 = in_RDI + 8;
  local_20._M_current =
       (shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *)
       Catch::clara::std::
       vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_28 = (shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
              *)Catch::clara::std::
                vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
                ::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_*,_std::vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<const_std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_*,_std::vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>_>
                             *)in_stack_ffffffffffffffa8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_*,_std::vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>_>
    ::operator*(&local_20);
    Catch::clara::std::
    shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
    shared_ptr(in_stack_ffffffffffffffb0,
               (shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                *)in_stack_ffffffffffffffa8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      Catch::clara::std::
      __shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a8ba7);
      in_stack_ffffffffffffffb0 =
           (shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *
           )Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
            size(in_stack_ffffffffffffffc0);
      local_10 = (long)&(in_stack_ffffffffffffffb0->
                        super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr + local_10;
    }
    Catch::clara::std::
    shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
    ~shared_ptr((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                 *)0x2a8beb);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_*,_std::vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>_>
    ::operator++(&local_20);
  }
  return local_10;
}

Assistant:

std::size_t connected_receivers() const {
    std::size_t size = 0;
    for (EventSignalPtr handler : handlers_) {
      if (handler) size += handler->size();
    }
    return size;
  }